

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall
kaitai::validation_failed_error::validation_failed_error
          (validation_failed_error *this,string *what,kstream *io,string *src_path)

{
  uint64_t val;
  string sStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  type local_48;
  
  val = kstream::pos(io);
  kstream::to_string<unsigned_long>(&local_48,val);
  std::operator+(&local_a8,"at pos ",&local_48);
  std::operator+(&local_88,&local_a8,": validation failed: ");
  std::operator+(&local_68,&local_88,what);
  std::__cxx11::string::string((string *)&sStack_c8,(string *)src_path);
  kstruct_error::kstruct_error(&this->super_kstruct_error,&local_68,&sStack_c8);
  std::__cxx11::string::~string((string *)&sStack_c8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&this->super_kstruct_error = &PTR__kstruct_error_002809f0;
  this->m_io = io;
  return;
}

Assistant:

validation_failed_error(const std::string what, kstream* io, const std::string src_path):
        kstruct_error("at pos " + kstream::to_string(io->pos()) + ": validation failed: " + what, src_path),
        m_io(io)
    {
    }